

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void __thiscall serialize_tests::class_methods::test_method(class_methods *this)

{
  long lVar1;
  string stringvalin;
  string stringvalin_00;
  bool bVar2;
  DataStream *pDVar3;
  CTransactionRef *txvalin;
  iterator pvVar4;
  CTransactionRef *pCVar5;
  iterator pvVar6;
  array<std::byte,_2UL> *paVar7;
  byte *pbVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  check_type cVar9;
  undefined8 in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 local_3e1;
  char *local_3e0;
  char *local_3d8;
  Span<std::byte> local_3d0;
  undefined1 *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  byte out_3;
  char *local_388;
  char *local_380;
  DataStream ds;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  DataStream ss2;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  DataStream ss;
  CTransactionRef tx_ref;
  CMutableTransaction txval;
  array<std::byte,_2UL> out;
  string in;
  CSerializeMethodsTestMany methodtest4;
  CSerializeMethodsTestSingle methodtest3;
  string local_138 [32];
  CSerializeMethodsTestMany methodtest2;
  string local_d0 [32];
  CSerializeMethodsTestSingle methodtest1;
  uint8_t charstrval [16];
  string stringval;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stringval,"testing",(allocator<char> *)&methodtest1);
  builtin_memcpy(charstrval,"testing charstr",0x10);
  CMutableTransaction::CMutableTransaction(&txval);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_ref);
  std::__cxx11::string::string(local_d0,&stringval);
  stringvalin._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffb9c;
  stringvalin._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb98;
  stringvalin._M_string_length = (size_type)_cVar9;
  stringvalin.field_2._M_allocated_capacity = in_stack_fffffffffffffba8;
  stringvalin.field_2._8_8_ = in_stack_fffffffffffffbb0;
  CSerializeMethodsTestSingle::CSerializeMethodsTestSingle
            (&methodtest1,100,true,stringvalin,(uint8_t *)local_d0,(CTransactionRef *)charstrval);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::string(local_138,&stringval);
  txvalin = (CTransactionRef *)charstrval;
  pCVar5 = &tx_ref;
  stringvalin_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffb9c;
  stringvalin_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb98;
  stringvalin_00._M_string_length = (size_type)_cVar9;
  stringvalin_00.field_2._M_allocated_capacity = in_stack_fffffffffffffba8;
  stringvalin_00.field_2._8_8_ = in_stack_fffffffffffffbb0;
  CSerializeMethodsTestSingle::CSerializeMethodsTestSingle
            (&methodtest2.super_CSerializeMethodsTestSingle,100,true,stringvalin_00,
             (uint8_t *)local_138,txvalin);
  std::__cxx11::string::~string(local_138);
  methodtest3.stringval._M_dataplus._M_p = (pointer)&methodtest3.stringval.field_2;
  methodtest3.stringval._M_string_length = 0;
  methodtest3.stringval.field_2._M_local_buf[0] = '\0';
  methodtest4.super_CSerializeMethodsTestSingle.stringval._M_dataplus._M_p =
       (pointer)&methodtest4.super_CSerializeMethodsTestSingle.stringval.field_2;
  methodtest4.super_CSerializeMethodsTestSingle.stringval._M_string_length = 0;
  methodtest3.txval.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  methodtest3.txval.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  methodtest4.super_CSerializeMethodsTestSingle.stringval.field_2._M_local_buf[0] = '\0';
  methodtest4.super_CSerializeMethodsTestSingle.txval.
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  methodtest4.super_CSerializeMethodsTestSingle.txval.
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ss.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ss.m_read_pos = 0;
  ss.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ss.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x100;
  file.m_begin = (iterator)&local_268;
  msg.m_end = (iterator)pCVar5;
  msg.m_begin = (iterator)txvalin;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_278,msg);
  bVar2 = CSerializeMethodsTestSingle::operator==
                    (&methodtest1,&methodtest2.super_CSerializeMethodsTestSingle);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar2);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in._M_dataplus._M_p = "methodtest1 == methodtest2";
  in._M_string_length = (long)"methodtest1 == methodtest2" + 0x1a;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011481f0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_2a0 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  ss2.m_read_pos = (size_type)&in;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ds,(lazy_ostream *)&ss2,1,0,WARN,_cVar9,(size_t)&local_2a8,0x100);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CSerializeMethodsTestSingle::
  SerializationOps<DataStream,serialize_tests::CSerializeMethodsTestSingle_const,ActionSerialize>
            (&methodtest1,&ss);
  CSerializeMethodsTestMany::
  SerializationOps<DataStream,serialize_tests::CSerializeMethodsTestMany,ActionUnserialize>
            (&methodtest4,&ss);
  CSerializeMethodsTestMany::
  SerializationOps<DataStream,serialize_tests::CSerializeMethodsTestMany_const,ActionSerialize>
            (&methodtest2,&ss);
  CSerializeMethodsTestSingle::
  SerializationOps<DataStream,serialize_tests::CSerializeMethodsTestSingle,ActionUnserialize>
            (&methodtest3,&ss);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x105;
  file_00.m_begin = (iterator)&local_2b8;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2c8,
             msg_00);
  bVar2 = CSerializeMethodsTestSingle::operator==
                    (&methodtest1,&methodtest2.super_CSerializeMethodsTestSingle);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar2);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in._M_dataplus._M_p = "methodtest1 == methodtest2";
  in._M_string_length = (long)"methodtest1 == methodtest2" + 0x1a;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011481f0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_2d0 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  ss2.m_read_pos = (size_type)&in;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ds,(lazy_ostream *)&ss2,1,0,WARN,_cVar9,(size_t)&local_2d8,0x105);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x106;
  file_01.m_begin = (iterator)&local_2e8;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2f8,
             msg_01);
  bVar2 = CSerializeMethodsTestSingle::operator==
                    (&methodtest2.super_CSerializeMethodsTestSingle,&methodtest3);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar2);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in._M_dataplus._M_p = "methodtest2 == methodtest3";
  in._M_string_length = (long)"methodtest2 == methodtest3" + 0x1a;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011481f0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_300 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  ss2.m_read_pos = (size_type)&in;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ds,(lazy_ostream *)&ss2,1,0,WARN,_cVar9,(size_t)&local_308,0x106);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x107;
  file_02.m_begin = (iterator)&local_318;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_328,
             msg_02);
  bVar2 = CSerializeMethodsTestSingle::operator==
                    (&methodtest3,&methodtest4.super_CSerializeMethodsTestSingle);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar2);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in._M_dataplus._M_p = "methodtest3 == methodtest4";
  in._M_string_length = (long)"methodtest3 == methodtest4" + 0x1a;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011481f0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_330 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  ss2.m_read_pos = (size_type)&in;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ds,(lazy_ostream *)&ss2,1,0,WARN,_cVar9,(size_t)&local_338,0x107);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ss2.m_read_pos = 0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ser_writedata32<DataStream>(&ss2,100);
  ::Serialize<DataStream>(&ss2,true);
  Serialize<DataStream,char>(&ss2,&stringval);
  Serialize<DataStream,_unsigned_char,_16>(&ss2,&charstrval);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = &::TX_WITH_WITNESS.allow_witness;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&txval;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction>::Serialize<DataStream>
            ((ParamsWrapper<TransactionSerParams,_CMutableTransaction> *)&ds,&ss2);
  CSerializeMethodsTestSingle::
  SerializationOps<DataStream,serialize_tests::CSerializeMethodsTestSingle,ActionUnserialize>
            (&methodtest3,&ss2);
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x10c;
  file_03.m_begin = (iterator)&local_348;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_358,
             msg_03);
  bVar2 = CSerializeMethodsTestSingle::operator==
                    (&methodtest3,&methodtest4.super_CSerializeMethodsTestSingle);
  in._M_dataplus._M_p._0_1_ = bVar2;
  in._M_string_length = 0;
  in.field_2._M_allocated_capacity = 0;
  ds.m_read_pos = (size_type)&local_3d0;
  local_3d0.m_data = (byte *)0xc1be0c;
  local_3d0.m_size = 0xc1be26;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011481f0;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_380 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&in,(lazy_ostream *)&ds,1,0,WARN,_cVar9,(size_t)&local_388,0x10c);
  boost::detail::shared_count::~shared_count((shared_count *)&in.field_2._M_allocated_capacity);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ds.m_read_pos = 0;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,"ab",(allocator<char> *)&local_3d0);
  local_3d0.m_data = (byte *)in._M_dataplus._M_p;
  local_3d0.m_size = in._M_string_length;
  pDVar3 = DataStream::operator<<(&ds,(Span<const_char> *)&local_3d0);
  ser_writedata8<DataStream>(pDVar3,'c');
  local_3d0.m_data = out._M_elems;
  local_3d0.m_size = 2;
  pDVar3 = DataStream::operator>>(&ds,&local_3d0);
  out_3 = ser_readdata8<DataStream>(pDVar3);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x114;
  file_04.m_begin = (iterator)&local_3a0;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3b0,
             msg_04);
  local_3d0.m_size = local_3d0.m_size & 0xffffffffffffff00;
  local_3d0.m_data = (byte *)&PTR__lazy_ostream_011480b0;
  local_3c0 = boost::unit_test::lazy_ostream::inst;
  local_3b8 = "";
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_3d8 = "";
  local_3e1 = 0x61;
  pvVar4 = (iterator)0x2;
  paVar7 = &out;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::byte,std::byte>
            (&local_3d0,&local_3e0,0x114,1,2,paVar7,0xc1be27,&local_3e1,"std::byte{\'a\'}");
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x115;
  file_05.m_begin = (iterator)&local_3f8;
  msg_05.m_end = (iterator)paVar7;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_408,
             msg_05);
  local_3d0.m_size = local_3d0.m_size & 0xffffffffffffff00;
  local_3d0.m_data = (byte *)&PTR__lazy_ostream_011480b0;
  local_3c0 = boost::unit_test::lazy_ostream::inst;
  local_3b8 = "";
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_410 = "";
  pbVar8 = out._M_elems + 1;
  local_3e1 = 0x62;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::byte,std::byte>
            (&local_3d0,&local_418,0x115,1,2,pbVar8,0xc1be40,&local_3e1,"std::byte{\'b\'}");
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x116;
  file_06.m_begin = (iterator)&local_428;
  msg_06.m_end = (iterator)pbVar8;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_438,
             msg_06);
  local_3d0.m_size = local_3d0.m_size & 0xffffffffffffff00;
  local_3d0.m_data = (byte *)&PTR__lazy_ostream_011480b0;
  local_3c0 = boost::unit_test::lazy_ostream::inst;
  local_3b8 = "";
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_440 = "";
  local_3e1 = 99;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::byte,std::byte>
            (&local_3d0,&local_448,0x116,1,2,&out_3,0xc1be59,&local_3e1,"std::byte{\'c\'}");
  std::__cxx11::string::~string((string *)&in);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ds);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ss2);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ss);
  CSerializeMethodsTestSingle::~CSerializeMethodsTestSingle
            (&methodtest4.super_CSerializeMethodsTestSingle);
  CSerializeMethodsTestSingle::~CSerializeMethodsTestSingle(&methodtest3);
  CSerializeMethodsTestSingle::~CSerializeMethodsTestSingle
            (&methodtest2.super_CSerializeMethodsTestSingle);
  CSerializeMethodsTestSingle::~CSerializeMethodsTestSingle(&methodtest1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_ref.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  CMutableTransaction::~CMutableTransaction(&txval);
  std::__cxx11::string::~string((string *)&stringval);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(class_methods)
{
    int intval(100);
    bool boolval(true);
    std::string stringval("testing");
    const uint8_t charstrval[16]{"testing charstr"};
    CMutableTransaction txval;
    CTransactionRef tx_ref{MakeTransactionRef(txval)};
    CSerializeMethodsTestSingle methodtest1(intval, boolval, stringval, charstrval, tx_ref);
    CSerializeMethodsTestMany methodtest2(intval, boolval, stringval, charstrval, tx_ref);
    CSerializeMethodsTestSingle methodtest3;
    CSerializeMethodsTestMany methodtest4;
    DataStream ss;
    BOOST_CHECK(methodtest1 == methodtest2);
    ss << methodtest1;
    ss >> methodtest4;
    ss << methodtest2;
    ss >> methodtest3;
    BOOST_CHECK(methodtest1 == methodtest2);
    BOOST_CHECK(methodtest2 == methodtest3);
    BOOST_CHECK(methodtest3 == methodtest4);

    DataStream ss2;
    ss2 << intval << boolval << stringval << charstrval << TX_WITH_WITNESS(txval);
    ss2 >> methodtest3;
    BOOST_CHECK(methodtest3 == methodtest4);
    {
        DataStream ds;
        const std::string in{"ab"};
        ds << Span{in} << std::byte{'c'};
        std::array<std::byte, 2> out;
        std::byte out_3;
        ds >> Span{out} >> out_3;
        BOOST_CHECK_EQUAL(out.at(0), std::byte{'a'});
        BOOST_CHECK_EQUAL(out.at(1), std::byte{'b'});
        BOOST_CHECK_EQUAL(out_3, std::byte{'c'});
    }
}